

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

void __thiscall
dg::vr::ValueRelations::add
          (ValueRelations *this,V val,Handle h,VectorSet<const_llvm::Value_*> *vals)

{
  const_iterator __pos;
  bool bVar1;
  Bucket *lt;
  pointer ppVar2;
  Bucket *in_RDX;
  Value *in_RSI;
  ValueRelations *in_RDI;
  Handle oldH;
  V oldVal;
  iterator it;
  Bucket *in_stack_ffffffffffffff68;
  Bucket *in_stack_ffffffffffffff70;
  BucketToVals *this_00;
  Value *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar3;
  Value **in_stack_ffffffffffffff90;
  _Rb_tree_const_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
  in_stack_ffffffffffffff98;
  Bucket *local_60;
  less<const_llvm::Value_*> local_31;
  _Self local_30;
  _Self local_28 [2];
  Bucket *local_18;
  Value *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
       ::lower_bound((map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                      *)in_stack_ffffffffffffff68,(key_type *)0x20a452);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
       ::end((map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
              *)in_stack_ffffffffffffff68);
  bVar1 = std::operator!=(local_28,&local_30);
  bVar3 = 0;
  if (bVar1) {
    std::
    map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
    ::key_comp((map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                *)in_stack_ffffffffffffff70);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
                           *)0x20a4ad);
    bVar1 = std::less<const_llvm::Value_*>::operator()(&local_31,local_10,ppVar2->first);
    bVar3 = bVar1 ^ 0xff;
    in_stack_ffffffffffffff78 = local_10;
  }
  if ((bVar3 & 1) == 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
    ::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
                *)&stack0xffffffffffffff98,local_28);
    __pos._M_node._7_1_ = bVar3;
    __pos._M_node._0_7_ = in_stack_ffffffffffffff88;
    std::
    map<llvm::Value_const*,std::reference_wrapper<dg::vr::Bucket_const>,std::less<llvm::Value_const*>,std::allocator<std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>>>
    ::emplace_hint<llvm::Value_const*&,dg::vr::Bucket_const&>
              ((map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                *)in_RDI,__pos,(Value **)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
                  *)0x20a4dc);
    lt = std::reference_wrapper::operator_cast_to_Bucket_
                   ((reference_wrapper<const_dg::vr::Bucket> *)0x20a4e8);
    bVar1 = vr::operator==(lt,local_18);
    if (bVar1) {
      return;
    }
    std::
    _Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
                  *)0x20a50d);
    std::
    _Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
                  *)0x20a51f);
    std::reference_wrapper::operator_cast_to_Bucket_
              ((reference_wrapper<const_dg::vr::Bucket> *)0x20a52b);
    this_00 = &in_RDI->bucketToVals;
    std::reference_wrapper<dg::vr::Bucket_const>::
    reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
              ((reference_wrapper<const_dg::vr::Bucket> *)this_00,in_stack_ffffffffffffff68);
    std::
    map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
    ::find((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
            *)in_stack_ffffffffffffff68,(key_type *)0x20a561);
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>
                  *)0x20a570);
    VectorSet<llvm::Value_const*>::erase<llvm::Value_const*,bool>
              ((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff98._M_node,
               in_stack_ffffffffffffff90);
    std::reference_wrapper<dg::vr::Bucket_const>::
    reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
              ((reference_wrapper<const_dg::vr::Bucket> *)this_00,in_stack_ffffffffffffff68);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
                           *)0x20a59d);
    (ppVar2->second)._M_data = local_60;
  }
  VectorSet<llvm::Value_const*>::emplace<llvm::Value_const*&>
            ((VectorSet<const_llvm::Value_*> *)in_RDI,(Value **)in_stack_ffffffffffffff78);
  updateChanged(in_RDI,true);
  return;
}

Assistant:

void ValueRelations::add(V val, Handle h, VectorSet<V> &vals) {
    ValToBucket::iterator it = valToBucket.lower_bound(val);
    // val already bound to a handle
    if (it != valToBucket.end() && !(valToBucket.key_comp()(val, it->first))) {
        // it is already bound to passed handle
        if (it->second == h)
            return;
        V oldVal = it->first;
        Handle oldH = it->second;
        assert(bucketToVals.find(oldH) != bucketToVals.end());
        assert(bucketToVals.at(oldH).find(oldVal) !=
               bucketToVals.at(oldH).end());
        bucketToVals.find(oldH)->second.erase(oldVal);
        it->second = h;
    } else
        valToBucket.emplace_hint(it, val, h);

    assert(valToBucket.find(val)->second == h);
    vals.emplace(val);
    updateChanged(true);
}